

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

void __thiscall Gecko::Graph::relax(Graph *this,bool compatible,uint m)

{
  uint uVar1;
  long *plVar2;
  Graph *pGVar3;
  reference puVar4;
  reference pNVar5;
  int in_EDX;
  byte in_SIL;
  long in_RDI;
  bool bVar6;
  Graph *unaff_retaddr;
  Index i;
  uint k;
  Float in_stack_ffffffffffffff7c;
  Graph *in_stack_ffffffffffffff80;
  byte local_71;
  uint local_4c;
  allocator local_45 [19];
  byte local_32;
  allocator local_31;
  string local_30 [32];
  int local_10;
  byte local_9;
  long lVar7;
  
  local_9 = in_SIL & 1;
  plVar2 = *(long **)(in_RDI + 8);
  local_32 = 0;
  bVar6 = local_9 == 0;
  local_10 = in_EDX;
  lVar7 = in_RDI;
  if (bVar6) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"frelax",local_45);
  }
  else {
    std::allocator<char>::allocator();
    local_32 = 1;
    std::__cxx11::string::string(local_30,"crelax",&local_31);
  }
  (**(code **)(*plVar2 + 0x30))(plVar2,in_RDI,local_30);
  std::__cxx11::string::~string(local_30);
  if (bVar6) {
    std::allocator<char>::~allocator((allocator<char> *)local_45);
  }
  if ((local_32 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  while (local_10 != 0) {
    local_4c = 0;
    local_10 = local_10 + -1;
    while( true ) {
      in_stack_ffffffffffffff80 = (Graph *)(ulong)local_4c;
      pGVar3 = (Graph *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                   (in_RDI + 0x10));
      local_71 = 0;
      if (in_stack_ffffffffffffff80 < pGVar3) {
        local_71 = (**(code **)(**(long **)(in_RDI + 8) + 0x40))();
        local_71 = local_71 ^ 0xff;
      }
      if ((local_71 & 1) == 0) break;
      puVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x10),
                          (ulong)local_4c);
      uVar1 = *puVar4;
      if (((local_9 & 1) == 0) ||
         (bVar6 = persistent(in_stack_ffffffffffffff80,(Index)in_stack_ffffffffffffff7c), !bVar6)) {
        in_stack_ffffffffffffff7c = optimal(unaff_retaddr,(Index)((ulong)lVar7 >> 0x20));
        pNVar5 = std::vector<Gecko::Node,_std::allocator<Gecko::Node>_>::operator[]
                           ((vector<Gecko::Node,_std::allocator<Gecko::Node>_> *)(in_RDI + 0x28),
                            (ulong)uVar1);
        pNVar5->pos = in_stack_ffffffffffffff7c;
      }
      local_4c = local_4c + 1;
    }
  }
  local_10 = local_10 + -1;
  place(in_stack_ffffffffffffff80,SUB41((uint)in_stack_ffffffffffffff7c >> 0x18,0));
  (**(code **)(**(long **)(in_RDI + 8) + 0x38))(*(long **)(in_RDI + 8),in_RDI,1);
  return;
}

Assistant:

void
Graph::relax(bool compatible, uint m)
{
  progress->beginphase(this, compatible ? string("crelax") : string("frelax"));
  while (m--)
    for (uint k = 0; k < perm.size() && !progress->quit(); k++) {
      Node::Index i = perm[k];
      if (!compatible || !persistent(i))
        node[i].pos = optimal(i);
    }
  place(true);
  progress->endphase(this, true);
}